

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip6.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnIPv6::ColumnIPv6(ColumnIPv6 *this,ColumnRef *data)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  Column *in_RSI;
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffa8;
  Column *in_stack_ffffffffffffffb0;
  
  Type::CreateIPv6();
  Column::Column(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x210d17);
  *in_RDI = &PTR__ColumnIPv6_002a0210;
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x210d3d);
  Column::As<clickhouse::ColumnFixedString>(in_RSI);
  peVar2 = std::
           __shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x210d5a);
  iVar1 = (*(peVar2->super_Column)._vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"number of entries must be even (two 64-bit numbers for each IPv6)");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

ColumnIPv6::ColumnIPv6(ColumnRef data)
    : Column(Type::CreateIPv6())
    , data_(data->As<ColumnFixedString>())
{
    if (data_->Size() != 0) {
        throw std::runtime_error("number of entries must be even (two 64-bit numbers for each IPv6)");
    }
}